

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationbutton.cpp
# Opt level: O1

void QtMWidgets::NavigationButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Direction *pDVar1;
  undefined8 uVar2;
  Direction DVar3;
  QColor *pQVar4;
  
  if (_c == WriteProperty) {
    pQVar4 = (QColor *)*_a;
    if (_id == 2) {
      setArrowColor((NavigationButton *)_o,pQVar4);
      return;
    }
    if (_id == 1) {
      setTextColor((NavigationButton *)_o,pQVar4);
      return;
    }
    if (_id == 0) {
      setDirection((NavigationButton *)_o,pQVar4->cspec);
      return;
    }
  }
  else if (_c == ReadProperty) {
    pDVar1 = (Direction *)*_a;
    if (_id == 2) {
      pQVar4 = arrowColor((NavigationButton *)_o);
    }
    else {
      if (_id != 1) {
        if (_id != 0) {
          return;
        }
        DVar3 = direction((NavigationButton *)_o);
        *pDVar1 = DVar3;
        return;
      }
      pQVar4 = textColor((NavigationButton *)_o);
    }
    uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
    *(undefined8 *)pDVar1 = *(undefined8 *)pQVar4;
    *(undefined8 *)((long)pDVar1 + 6) = uVar2;
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      _q_released((NavigationButton *)_o);
      return;
    }
    if (_id == 0) {
      _q_pressed((NavigationButton *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QtMWidgets::NavigationButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<NavigationButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_pressed(); break;
        case 1: _t->_q_released(); break;
        default: ;
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<NavigationButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Direction*>(_v) = _t->direction(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->textColor(); break;
        case 2: *reinterpret_cast< QColor*>(_v) = _t->arrowColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<NavigationButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDirection(*reinterpret_cast< Direction*>(_v)); break;
        case 1: _t->setTextColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setArrowColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_a;
}